

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O0

void zzGCD(word *d,word *a,size_t n,word *b,size_t m,void *stack)

{
  int iVar1;
  bool_t bVar2;
  word *b_00;
  size_t sVar3;
  size_t sVar4;
  word wVar5;
  word *in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  ulong in_R8;
  word *in_R9;
  word *v;
  word *u;
  size_t s;
  word *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  word *in_stack_ffffffffffffff70;
  word *in_stack_ffffffffffffff78;
  word *a_00;
  size_t local_58;
  size_t local_28;
  size_t local_18;
  
  b_00 = in_R9 + in_RDX;
  local_58 = in_R8;
  if (in_RDX < in_R8) {
    local_58 = in_RDX;
  }
  wwSetZero(in_RDI,local_58);
  wwCopy(in_R9,in_RSI,in_RDX);
  wwCopy(b_00,in_RCX,in_R8);
  sVar3 = wwLoZeroBits(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  sVar4 = wwLoZeroBits(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  utilMin(2,sVar3,sVar4);
  wwShLo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  local_18 = wwWordSize(in_R9,in_RDX);
  wwShLo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  local_28 = wwWordSize(b_00,in_R8);
  do {
    a_00 = in_R9;
    wwLoZeroBits(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    wwShLo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    local_18 = wwWordSize(in_R9,local_18);
    wwLoZeroBits(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    wwShLo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    local_28 = wwWordSize(b_00,local_28);
    iVar1 = wwCmp2(a_00,(size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
    if (iVar1 < 1) {
      in_stack_ffffffffffffff60 = b_00 + local_18;
      in_stack_ffffffffffffff68 = local_28 - local_18;
      wVar5 = zzSub2(b_00,in_R9,local_18);
      zzSubW2(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,wVar5);
    }
    else {
      in_stack_ffffffffffffff70 = in_R9 + local_28;
      in_stack_ffffffffffffff78 = (word *)(local_18 - local_28);
      wVar5 = zzSub2(in_R9,b_00,local_28);
      zzSubW2(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff78,wVar5);
    }
    bVar2 = wwIsZero(b_00,local_28);
  } while (bVar2 == 0);
  wwCopy(in_RDI,in_R9,local_18);
  wwBitSize(in_stack_ffffffffffffff60,(size_t)in_RDI);
  wwShHi(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void zzGCD(word d[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register size_t s;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	stack = v + m;
	// pre
	ASSERT(wwIsDisjoint2(a, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(b, m, d, MIN2(n, m)));
	ASSERT(!wwIsZero(a, n) && !wwIsZero(b, m));
	// d <- 0
	wwSetZero(d, MIN2(n, m));
	// u <- a, v <- b
	wwCopy(u, a, n);
	wwCopy(v, b, m);
	// найти максимальное s т.ч. 2^s | u и 2^s | v
	s = utilMin(2, wwLoZeroBits(u, n), wwLoZeroBits(v, m));
	// u <- u / 2^s, v <- v / 2^s
	wwShLo(u, n, s);
	n = wwWordSize(u, n);
	wwShLo(v, m, s);
	m = wwWordSize(v, m);
	// итерации
	do
	{
		wwShLo(u, n, wwLoZeroBits(u, n));
		n = wwWordSize(u, n);
		wwShLo(v, m, wwLoZeroBits(v, m));
		m = wwWordSize(v, m);
		// u > v?
		if (wwCmp2(u, n, v, m) > 0)
			// u <- u - v
			zzSubW2(u + m, n - m, zzSub2(u, v, m));
		else
			// v <- v - u
			zzSubW2(v + n, m - n, zzSub2(v, u, n));
	} while (!wwIsZero(v, m));
	// d <- v
	wwCopy(d, u, n);
	// d <- d * 2^s
	wwShHi(d, W_OF_B(wwBitSize(d, m) + s), s);
	// очистка
	s = 0;
}